

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O2

void __thiscall
QNonContiguousByteDeviceRingBufferImpl::QNonContiguousByteDeviceRingBufferImpl
          (QNonContiguousByteDeviceRingBufferImpl *this,shared_ptr<QRingBuffer> rb)

{
  Data *pDVar1;
  QRingChunk *pQVar2;
  element_type *peVar3;
  
  peVar3 = rb.super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QNonContiguousByteDevice::QNonContiguousByteDevice((QNonContiguousByteDevice *)this);
  *(undefined ***)this = &PTR_metaObject_006618b0;
  *(undefined8 *)(this + 0x18) = 0;
  pDVar1 = (peVar3->buffers).d.d;
  pQVar2 = (peVar3->buffers).d.ptr;
  (peVar3->buffers).d.ptr = (QRingChunk *)0x0;
  *(Data **)(this + 0x10) = pDVar1;
  *(QRingChunk **)(this + 0x18) = pQVar2;
  (peVar3->buffers).d.d = (Data *)0x0;
  *(undefined8 *)(this + 0x20) = 0;
  return;
}

Assistant:

QNonContiguousByteDeviceRingBufferImpl::QNonContiguousByteDeviceRingBufferImpl(std::shared_ptr<QRingBuffer> rb)
    : QNonContiguousByteDevice(), ringBuffer(std::move(rb))
{
}